

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable
          (ParseFunctionGenerator *this,Formatter *format)

{
  pointer pcVar1;
  byte bVar2;
  int *args;
  FileOptions_OptimizeMode FVar3;
  LogMessage *other;
  undefined8 *puVar4;
  size_type *args_1;
  Options *in_RDX;
  Options *extraout_RDX;
  char *format_00;
  ScopedIndenter fast_scope;
  ScopedIndenter table_scope;
  ScopedIndenter header_scope;
  string fallback;
  int local_b0;
  int local_ac;
  string local_a8;
  string local_88;
  Formatter *local_68;
  undefined1 local_60 [56];
  
  other = (LogMessage *)format;
  if (this->options_->tctable_mode == kTCTableNever) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x21d);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_60,"CHECK failed: should_generate_tctable(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a8,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_60);
    in_RDX = extraout_RDX;
  }
  pcVar1 = local_60 + 0x10;
  local_60._8_8_ = (char *)0x0;
  local_60[0x10] = '\0';
  local_60._0_8_ = pcVar1;
  if (((this->tc_table_info_)._M_t.
       super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
       .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>.
      _M_head_impl)->use_generated_fallback == true) {
    ClassName_abi_cxx11_(&local_88,(cpp *)this->descriptor_,(Descriptor *)in_RDX);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
    args_1 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)args_1) {
      local_a8.field_2._M_allocated_capacity = *args_1;
      local_a8.field_2._8_8_ = puVar4[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *args_1;
      local_a8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_a8._M_string_length = puVar4[1];
    *puVar4 = args_1;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  else {
    (anonymous_namespace)::TcParserName_abi_cxx11_(&local_88,(_anonymous_namespace_ *)other,in_RDX);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
    args_1 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)args_1) {
      local_a8.field_2._M_allocated_capacity = *args_1;
      local_a8.field_2._8_8_ = puVar4[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *args_1;
      local_a8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_a8._M_string_length = puVar4[1];
    *puVar4 = args_1;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    FVar3 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_,(bool *)0x0
                          );
    if (FVar3 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      std::__cxx11::string::append(local_60);
    }
  }
  Formatter::operator()
            (format,
             "const ::$proto_ns$::internal::TcParseTable<$1$>\n    $classname$::_table_ = {\n",
             &((this->tc_table_info_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>.
              _M_head_impl)->table_size_log2);
  local_88._M_dataplus._M_p = (pointer)format;
  io::Printer::Indent(format->printer_);
  Formatter::operator()<>(format,"{\n");
  local_68 = format;
  io::Printer::Indent(format->printer_);
  if ((this->num_hasbits_ < 1) && (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\x01'))
  {
    format_00 = "0,  // no _has_bits_\n";
  }
  else {
    format_00 = "PROTOBUF_FIELD_OFFSET($classname$, _has_bits_),\n";
  }
  Formatter::operator()<>(format,format_00);
  if (*(int *)(this->descriptor_ + 0x78) == 1) {
    args = *(int **)(this->descriptor_ + 0x48);
    args_1 = (size_type *)(args + 1);
    Formatter::operator()
              (format,
               "PROTOBUF_FIELD_OFFSET($classname$, _extensions_),\n$1$, $2$,  // extension_range_{low,high}\n"
               ,args,(int *)args_1);
  }
  else {
    Formatter::operator()<>(format,"0, 0, 0,  // no _extensions_\n");
  }
  bVar2 = (byte)((this->tc_table_info_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>
                ._M_head_impl)->table_size_log2;
  local_ac = ~(-1 << (bVar2 & 0x1f)) << 3;
  local_b0 = *(int *)((cpp *)this->descriptor_ + 4);
  DefaultInstanceName_abi_cxx11_
            (&local_a8,(cpp *)this->descriptor_,(Descriptor *)this->options_,
             (Options *)CONCAT71((int7)((ulong)args_1 >> 8),bVar2));
  Formatter::operator()
            (format,
             "$1$, 0, $2$,  // fast_idx_mask, reserved, num_fields\n&$3$._instance,\n$4$  // fallback\n"
             ,&local_ac,&local_b0,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  io::Printer::Outdent(format->printer_);
  Formatter::operator()<>(format,"}, {\n");
  local_a8._M_dataplus._M_p = (pointer)format;
  io::Printer::Indent(format->printer_);
  GenerateFastFieldEntries(this,format,(string *)local_60);
  io::Printer::Outdent(format->printer_);
  Formatter::operator()<>(format,"},\n");
  io::Printer::Outdent(format->printer_);
  Formatter::operator()<>(format,"};\n\n");
  if ((pointer)local_60._0_8_ != pcVar1) {
    operator_delete((void *)local_60._0_8_);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailCallTable(Formatter& format) {
  GOOGLE_CHECK(should_generate_tctable());
  // All entries without a fast-path parsing function need a fallback.
  std::string fallback;
  if (tc_table_info_->use_generated_fallback) {
    fallback = ClassName(descriptor_) + "::Tct_ParseFallback";
  } else {
    fallback = TcParserName(options_) + "GenericFallback";
    if (GetOptimizeFor(descriptor_->file(), options_) ==
        FileOptions::LITE_RUNTIME) {
      fallback += "Lite";
    }
  }

  // For simplicity and speed, the table is not covering all proto
  // configurations. This model uses a fallback to cover all situations that
  // the table can't accommodate, together with unknown fields or extensions.
  // These are number of fields over 32, fields with 3 or more tag bytes,
  // maps, weak fields, lazy, more than 1 extension range. In the cases
  // the table is sufficient we can use a generic routine, that just handles
  // unknown fields and potentially an extension range.
  format(
      "const ::$proto_ns$::internal::TcParseTable<$1$>\n"
      "    $classname$::_table_ = {\n",
      tc_table_info_->table_size_log2);
  {
    auto table_scope = format.ScopedIndent();
    format("{\n");
    {
      auto header_scope = format.ScopedIndent();
      if (num_hasbits_ > 0 || IsMapEntryMessage(descriptor_)) {
        format("PROTOBUF_FIELD_OFFSET($classname$, _has_bits_),\n");
      } else {
        format("0,  // no _has_bits_\n");
      }
      if (descriptor_->extension_range_count() == 1) {
        format(
            "PROTOBUF_FIELD_OFFSET($classname$, _extensions_),\n"
            "$1$, $2$,  // extension_range_{low,high}\n",
            descriptor_->extension_range(0)->start,
            descriptor_->extension_range(0)->end);
      } else {
        format("0, 0, 0,  // no _extensions_\n");
      }
      format(
          "$1$, 0, $2$,  // fast_idx_mask, reserved, num_fields\n"
          "&$3$._instance,\n"
          "$4$  // fallback\n",
          (((1 << tc_table_info_->table_size_log2) - 1) << 3),
          descriptor_->field_count(),
          DefaultInstanceName(descriptor_, options_), fallback);
    }
    format("}, {\n");
    {
      auto fast_scope = format.ScopedIndent();
      GenerateFastFieldEntries(format, fallback);
    }
    format("},\n");  // entries[]
  }
  format("};\n\n");  // _table_
}